

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binsert(bstring b1,int pos,bstring b2,uchar fill)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bstring b;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if ((b2 == (bstring)0x0 || b1 == (bstring)0x0) || pos < 0) {
    return -1;
  }
  uVar6 = b1->slen;
  if ((int)uVar6 < 0) {
    return -1;
  }
  iVar2 = b2->slen;
  if (iVar2 < 0) {
    return -1;
  }
  uVar5 = b1->mlen;
  if ((int)uVar5 < 1 || (int)uVar5 < (int)uVar6) {
    return -1;
  }
  lVar4 = (long)b2->data - (long)b1->data;
  b = b2;
  if (lVar4 < (long)(ulong)uVar5 && -1 < lVar4) {
    b = bstrcpy(b2);
    if (b == (bstring)0x0) {
      return -1;
    }
    uVar6 = b1->slen;
    iVar2 = b->slen;
  }
  uVar5 = iVar2 + uVar6;
  uVar1 = iVar2 + pos;
  if ((int)(uVar5 | uVar1) < 0) {
    iVar2 = -1;
    goto LAB_00114eb5;
  }
  if ((int)uVar6 < pos) {
    iVar2 = balloc(b1,uVar1 + 1);
    if (iVar2 != 0) {
LAB_00114e76:
      iVar2 = -1;
      goto LAB_00114eb5;
    }
    for (lVar4 = (long)b1->slen; uVar5 = uVar1, lVar4 < (long)(ulong)(uint)pos; lVar4 = lVar4 + 1) {
      b1->data[lVar4] = fill;
    }
  }
  else {
    iVar3 = balloc(b1,uVar5 + 1);
    if (iVar3 != 0) goto LAB_00114e76;
    for (lVar4 = (long)iVar2 + (ulong)uVar6; (int)uVar1 < lVar4; lVar4 = lVar4 + -1) {
      b1->data[lVar4 + -1] = b1->data[~(long)b->slen + lVar4];
    }
  }
  b1->slen = uVar5;
  if (0 < (long)b->slen) {
    memmove(b1->data + (uint)pos,b->data,(long)b->slen);
    uVar5 = b1->slen;
  }
  b1->data[(int)uVar5] = '\0';
  iVar2 = 0;
LAB_00114eb5:
  if (b != b2) {
    bdestroy(b);
  }
  return iVar2;
}

Assistant:

int binsert (bstring b1, int pos, const bstring b2, unsigned char fill) {
int d, i, l;
ptrdiff_t pd;
bstring aux = b2;

	if (pos < 0 || b1 == NULL || b2 == NULL || b1->slen < 0 || 
	    b2->slen < 0 || b1->mlen < b1->slen || b1->mlen <= 0) return BSTR_ERR;

	/* Aliasing case */
	if ((pd = (ptrdiff_t) (b2->data - b1->data)) >= 0 && pd < (ptrdiff_t) b1->mlen) {
		if (NULL == (aux = bstrcpy (b2))) return BSTR_ERR;
	}

	/* Compute the two possible end pointers */
	d = b1->slen + aux->slen;
	l = pos + aux->slen;
	if ((d|l) < 0)
    {
        if (aux != b2) bdestroy (aux);
        return BSTR_ERR;
    }

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b1, l + 1) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
		for (d = b1->slen; d < pos; d++) b1->data[d] = fill;
		b1->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b1, d + 1) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
		for (i = d - 1; i >= l; i--) {
			b1->data[i] = b1->data[i - aux->slen];
		}
		b1->slen = d;
	}
	bBlockCopy (b1->data + pos, aux->data, aux->slen);
	b1->data[b1->slen] = (unsigned char) '\0';
	if (aux != b2) bdestroy (aux);
	return 0;
}